

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O2

int SSL_send_fatal_alert(SSL *ssl,uint8_t alert)

{
  SSL3_STATE *pSVar1;
  int iVar2;
  
  pSVar1 = ssl->s3;
  if ((pSVar1->field_0xdd & 4) == 0) {
    iVar2 = bssl::ssl_send_alert_impl(ssl,2,(uint)alert);
    return iVar2;
  }
  if ((pSVar1->send_alert[0] == '\x02') && (pSVar1->send_alert[1] == alert)) {
    iVar2 = (*ssl->method->dispatch_alert)(ssl);
    return iVar2;
  }
  ERR_put_error(0x10,0,0xc2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                ,0x435);
  return -1;
}

Assistant:

int SSL_send_fatal_alert(SSL *ssl, uint8_t alert) {
  if (ssl->s3->alert_dispatch) {
    if (ssl->s3->send_alert[0] != SSL3_AL_FATAL ||
        ssl->s3->send_alert[1] != alert) {
      // We are already attempting to write a different alert.
      OPENSSL_PUT_ERROR(SSL, SSL_R_PROTOCOL_IS_SHUTDOWN);
      return -1;
    }
    return ssl->method->dispatch_alert(ssl);
  }

  return ssl_send_alert_impl(ssl, SSL3_AL_FATAL, alert);
}